

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_str_offsets.c
# Opt level: O0

int dwarf_str_offsets_statistics
              (Dwarf_Str_Offsets_Table table_data,Dwarf_Unsigned *wasted_byte_count,
              Dwarf_Unsigned *table_count,Dwarf_Error *error)

{
  Dwarf_Error *error_local;
  Dwarf_Unsigned *table_count_local;
  Dwarf_Unsigned *wasted_byte_count_local;
  Dwarf_Str_Offsets_Table table_data_local;
  
  if (table_data == (Dwarf_Str_Offsets_Table)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x192);
    table_data_local._4_4_ = 1;
  }
  else if (table_data->so_dbg == (Dwarf_Debug)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x193);
    table_data_local._4_4_ = 1;
  }
  else if (table_data->so_magic_value == 0x2feed2) {
    if (wasted_byte_count != (Dwarf_Unsigned *)0x0) {
      *wasted_byte_count = table_data->so_wasted_section_bytes;
    }
    if (table_count != (Dwarf_Unsigned *)0x0) {
      *table_count = table_data->so_table_count;
    }
    table_data_local._4_4_ = 0;
  }
  else {
    _dwarf_error(table_data->so_dbg,error,0x194);
    table_data_local._4_4_ = 1;
  }
  return table_data_local._4_4_;
}

Assistant:

int
dwarf_str_offsets_statistics(Dwarf_Str_Offsets_Table table_data,
    Dwarf_Unsigned * wasted_byte_count,
    Dwarf_Unsigned * table_count,
    Dwarf_Error    * error)
{
    VALIDATE_SOT(table_data)
    if (wasted_byte_count) {
        *wasted_byte_count = table_data->so_wasted_section_bytes;
    }
    if (table_count) {
        *table_count = table_data->so_table_count;
    }
    return DW_DLV_OK;
}